

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_coded_block_pattern(bitstream *str,int chroma_format,uint32_t *cbp)

{
  int iVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  uint32_t cbplo;
  uint32_t tmp;
  undefined8 local_38;
  
  local_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
  local_38 = CONCAT44(local_38._4_4_,*cbp) & 0xffffffff0000003f;
  if (chroma_format == 1) {
    iVar1 = vs_vlc(str,(uint32_t *)&local_38,cbp_vlc);
    if (iVar1 != 0) {
      return 1;
    }
    uVar2 = (uint)local_38;
  }
  else {
    if (chroma_format != 2) {
      if (chroma_format != 3) {
        h262_coded_block_pattern_cold_1();
        return 1;
      }
      chroma_format = 6;
    }
    iVar1 = vs_vlc(str,(uint32_t *)&local_38,cbp_vlc);
    if (iVar1 != 0) {
      return 1;
    }
    uVar3 = 0;
    uVar2 = (uint)local_38;
    do {
      local_38 = (ulong)CONCAT14((*cbp >> (uVar3 & 0x1f) & 1) != 0,(uint)local_38);
      iVar1 = vs_u(str,(uint32_t *)((long)&local_38 + 4),1);
      if (iVar1 != 0) {
        return 1;
      }
      uVar2 = uVar2 | local_38._4_4_ << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + 1;
    } while (chroma_format != uVar3);
  }
  if (str->dir == VS_DECODE) {
    *cbp = uVar2;
  }
  return 0;
}

Assistant:

int h262_coded_block_pattern(struct bitstream *str, int chroma_format, uint32_t *cbp) {
	uint32_t cbplo = *cbp & 0x3f;
	int cbphs;
	int i;
	uint32_t val;
	switch (chroma_format) {
		case 1:
			cbphs = 0;
			break;
		case 2:
			cbphs = 2;
			break;
		case 3:
			cbphs = 6;
			break;
		default:
			fprintf(stderr, "Invalid chroma format\n");
			return 1;
	}
	if (vs_vlc(str, &cbplo, cbp_vlc)) return 1;
	val = cbplo;
	for (i = 0; i < cbphs; i++) {
		uint32_t tmp = *cbp >> i & 1;
		if (vs_u(str, &tmp, 1)) return 1;
		val |= tmp << i;
	}	
	if (str->dir == VS_DECODE)
		*cbp = val;
	return 0;
}